

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O0

SplittingStepCoefficients
SplittingStepCoefficients_ComposeStrang(int partitions,int order,int composition_stages)

{
  undefined4 in_EDX;
  int in_ESI;
  int unaff_retaddr;
  SplittingStepCoefficients coefficients;
  int stages;
  sunrealtype **in_stack_00000038;
  sunrealtype in_stack_00000040;
  sunrealtype in_stack_00000048;
  int in_stack_00000054;
  int in_stack_00000058;
  int in_stack_0000005c;
  SplittingStepCoefficients local_8;
  
  if ((in_ESI < 2) || (in_ESI % 2 != 0)) {
    local_8 = (SplittingStepCoefficients)0x0;
  }
  else {
    SUNIpowerI(in_EDX,in_ESI / 2 + -1,(long)in_ESI % 2 & 0xffffffff);
    local_8 = SplittingStepCoefficients_Alloc(coefficients._4_4_,(int)coefficients,unaff_retaddr);
    if (local_8 == (SplittingStepCoefficients)0x0) {
      local_8 = (SplittingStepCoefficients)0x0;
    }
    else {
      local_8->order = in_ESI;
      *local_8->alpha = 1.0;
      SplittingStepCoefficients_ComposeStrangHelper
                (in_stack_0000005c,in_stack_00000058,in_stack_00000054,in_stack_00000048,
                 in_stack_00000040,in_stack_00000038);
    }
  }
  return local_8;
}

Assistant:

static SplittingStepCoefficients SplittingStepCoefficients_ComposeStrang(
  const int partitions, const int order, const int composition_stages)
{
  if (order < 2 || order % 2 != 0)
  {
    // Only even orders allowed
    return NULL;
  }

  const int stages = 1 + (partitions - 1) *
                           SUNIpowerI(composition_stages, order / 2 - 1);
  const SplittingStepCoefficients coefficients =
    SplittingStepCoefficients_Alloc(1, stages, partitions);
  if (coefficients == NULL) { return NULL; }

  coefficients->order    = order;
  coefficients->alpha[0] = SUN_RCONST(1.0);

  SplittingStepCoefficients_ComposeStrangHelper(partitions, order,
                                                composition_stages,
                                                SUN_RCONST(0.0), SUN_RCONST(1.0),
                                                coefficients->beta[0]);

  return coefficients;
}